

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::RenderFrame(ImVec2 p_min,ImVec2 p_max,ImU32 fill_col,bool border,float rounding)

{
  ImGuiWindow *pIVar1;
  ImDrawList *pIVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  ImU32 IVar7;
  undefined7 in_register_00000031;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  ImVec2 local_78;
  ImVec2 local_70;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  ImVec4 local_48;
  ImVec2 local_38;
  ImVec2 local_30;
  
  local_68._8_4_ = in_XMM0_Dc;
  local_68._0_8_ = p_min;
  local_68._12_4_ = in_XMM0_Dd;
  local_58._8_4_ = in_XMM1_Dc;
  local_58._0_8_ = p_max;
  local_58._12_4_ = in_XMM1_Dd;
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->Accessed = true;
  local_78 = p_max;
  local_70 = p_min;
  ImDrawList::AddRectFilled(pIVar1->DrawList,&local_70,&local_78,fill_col,rounding,0xf);
  if (((int)CONCAT71(in_register_00000031,border) != 0) && ((pIVar1->Flags & 0x80) != 0)) {
    pIVar2 = pIVar1->DrawList;
    local_30.y = (float)local_68._4_4_ + 1.0;
    local_30.x = (float)local_68._0_4_ + 1.0;
    local_38.y = (float)local_58._4_4_ + 1.0;
    local_38.x = (float)local_58._0_4_ + 1.0;
    local_48.x = (GImGui->Style).Colors[6].x;
    local_48.y = (GImGui->Style).Colors[6].y;
    uVar3 = (GImGui->Style).Colors[6].z;
    uVar4 = (GImGui->Style).Colors[6].w;
    local_48.w = (GImGui->Style).Alpha * (float)uVar4;
    local_48.z = (float)uVar3;
    IVar7 = ColorConvertFloat4ToU32(&local_48);
    ImDrawList::AddRect(pIVar2,&local_30,&local_38,IVar7,rounding,0xf,1.0);
    pIVar2 = pIVar1->DrawList;
    local_48.x = (GImGui->Style).Colors[5].x;
    local_48.y = (GImGui->Style).Colors[5].y;
    uVar5 = (GImGui->Style).Colors[5].z;
    uVar6 = (GImGui->Style).Colors[5].w;
    local_48.w = (GImGui->Style).Alpha * (float)uVar6;
    local_48.z = (float)uVar5;
    IVar7 = ColorConvertFloat4ToU32(&local_48);
    ImDrawList::AddRect(pIVar2,&local_70,&local_78,IVar7,rounding,0xf,1.0);
  }
  return;
}

Assistant:

void ImGui::RenderFrame(ImVec2 p_min, ImVec2 p_max, ImU32 fill_col, bool border, float rounding)
{
    ImGuiWindow* window = GetCurrentWindow();

    window->DrawList->AddRectFilled(p_min, p_max, fill_col, rounding);
    if (border && (window->Flags & ImGuiWindowFlags_ShowBorders))
    {
        window->DrawList->AddRect(p_min+ImVec2(1,1), p_max+ImVec2(1,1), GetColorU32(ImGuiCol_BorderShadow), rounding);
        window->DrawList->AddRect(p_min, p_max, GetColorU32(ImGuiCol_Border), rounding);
    }
}